

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O1

void __thiscall
FormatToTest_FormatToNonbackInsertIteratorWithSignAndNumericAlignment_Test::TestBody
          (FormatToTest_FormatToNonbackInsertIteratorWithSignAndNumericAlignment_Test *this)

{
  bool bVar1;
  char *message;
  basic_string_view<char> format_str;
  basic_format_args<fmt::v5::basic_format_context<char_*,_char>_> args;
  AssertionResult gtest_ar;
  char buffer [16];
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  AssertHelper local_40;
  undefined8 local_38;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  local_28 = 0;
  uStack_20 = 0;
  local_38 = 0x4045000000000000;
  format_str.size_ = 6;
  format_str.data_ = "{: =+}";
  args.field_1.values_ = (value<fmt::v5::basic_format_context<char_*,_char>_> *)&local_38;
  args.types_ = fmt::v5::format_arg_store<fmt::v5::basic_format_context<char*,char>,double>::TYPES;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::output_range<char*,char>>,char,fmt::v5::basic_format_context<char*,char>>
            ((range)&local_28,format_str,args,(locale_ref)0x0);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_38,"\"+42\"","buffer","+42",(char *)&local_28);
  if (local_38._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    if (local_30.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_30.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x2d5,message);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (local_48.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_48.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_48.ptr_ + 8))();
      }
      local_48.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_30,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(FormatToTest, FormatToNonbackInsertIteratorWithSignAndNumericAlignment) {
  char buffer[16] = {};
  fmt::format_to(fmt::internal::make_checked(buffer, 16), "{: =+}", 42.0);
  EXPECT_STREQ("+42", buffer);
}